

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

void * __thiscall
v_hashmap<unsigned_long,_features>::iterator_next
          (v_hashmap<unsigned_long,_features> *this,void *prev)

{
  hash_elem *phVar1;
  hash_elem *e;
  hash_elem *phVar2;
  
  if (prev != (void *)0x0) {
    phVar1 = (hash_elem *)((long)prev + 0x80);
    while (phVar2 = phVar1, phVar2 != (this->dat).end_array) {
      phVar1 = phVar2 + 1;
      if (phVar2->occupied == true) {
        return phVar2;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* iterator_next(void* prev)
  {
    hash_elem* e = (hash_elem*)prev;
    if (e == nullptr)
      return nullptr;
    e++;
    while (e != dat.end_array)
    {
      if (e->occupied)
        return e;
      e++;
    }
    return nullptr;
  }